

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar_LibSetup0_rec(Dar_Lib_t *p,Dar_LibObj_t *pObj,int Class,int fCollect)

{
  int iVar1;
  Dar_LibObj_t DVar2;
  Dar_LibObj_t *pDVar3;
  int *piVar4;
  
  DVar2 = *pObj;
  if (DVar2._4_4_ >> 4 != Class && ((ulong)DVar2 & 0x800000000) == 0) {
    *pObj = (Dar_LibObj_t)((ulong)DVar2 & 0x7ffffffff | (ulong)(uint)Class << 0x24);
    Dar_LibSetup0_rec(p,(Dar_LibObj_t *)(&p->pObjs->field_0x0 + ((DVar2._0_4_ & 0xffff) << 3)),Class
                      ,fCollect);
    Dar_LibSetup0_rec(p,p->pObjs + *(ushort *)&pObj->field_0x2,Class,fCollect);
    if (fCollect == 0) {
      p->nNodes0[Class] = p->nNodes0[Class] + 1;
    }
    else {
      pDVar3 = p->pObjs;
      piVar4 = p->pNodes0[Class];
      iVar1 = p->nNodes0[Class];
      p->nNodes0[Class] = iVar1 + 1;
      piVar4[iVar1] = (int)((ulong)((long)pObj - (long)pDVar3) >> 3);
    }
  }
  return;
}

Assistant:

void Dar_LibSetup0_rec( Dar_Lib_t * p, Dar_LibObj_t * pObj, int Class, int fCollect )
{
    if ( pObj->fTerm || (int)pObj->Num == Class )
        return;
    pObj->Num = Class;
    Dar_LibSetup0_rec( p, Dar_LibObj(p, pObj->Fan0), Class, fCollect );
    Dar_LibSetup0_rec( p, Dar_LibObj(p, pObj->Fan1), Class, fCollect );
    if ( fCollect )
        p->pNodes0[Class][ p->nNodes0[Class]++ ] = pObj-p->pObjs;
    else
        p->nNodes0[Class]++;
}